

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumDotsTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumDotsTexture *this)

{
  SpectrumTextureHandle *in_R9;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ SpectrumDotsTexture mapping: %s insideDot: %s outsideDot: %s ]",(char *)this
             ,(TextureMapping2DHandle *)&this->insideDot,&this->outsideDot,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumDotsTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumDotsTexture mapping: %s insideDot: %s outsideDot: %s ]", mapping,
        insideDot, outsideDot);
}